

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_base64.hxx
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 cryptox::
 to_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  last,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           d_first)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  uint8_t input [128];
  uint8_t output [160];
  uchar local_148 [288];
  
  while (first._M_current != last._M_current) {
    for (uVar3 = 0;
        (puVar1 = (uchar *)first._M_current + uVar3, uVar3 < 0x80 &&
        (puVar1 != (uchar *)last._M_current)); uVar3 = uVar3 + 1) {
      local_148[uVar3] = *puVar1;
    }
    iVar2 = EVP_EncodeBlock(local_148 + 0x80,local_148,(int)uVar3);
    d_first = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<unsigned_char*,std::back_insert_iterator<std::__cxx11::string>>
                        (local_148 + 0x80,local_148 + (long)iVar2 + 0x80,d_first);
    first._M_current = (char *)puVar1;
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )d_first.container;
}

Assistant:

Output to_base64(Input first, Input last, Output d_first) {
		while (first != last) {
			std::uint8_t input[128];
			size_t input_size = 0;
			while (input_size < sizeof(input) && first != last)
				input[input_size++] = *first++;

			std::uint8_t output[160];
			const size_t output_size = EVP_EncodeBlock(output,
			                                           input,
			                                           input_size);

			d_first = std::copy(output, output + output_size, d_first);
		}

		return d_first;
	}